

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void __thiscall sensors_analytics::DefaultConsumer::DumpRecordToDisk(DefaultConsumer *this)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  reference pbVar4;
  ostream *this_00;
  iterator local_270;
  iterator local_250;
  undefined1 local_230 [8];
  const_iterator iterator;
  ofstream staging_ofs;
  DefaultConsumer *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_out,_S_trunc);
  std::ofstream::ofstream(&iterator._M_node,pcVar3,_Var2);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin(&local_250,&this->records_);
  std::_Deque_iterator<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const*>
  ::
  _Deque_iterator<std::_Deque_iterator<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string*>,void>
            ((_Deque_iterator<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const*>
              *)local_230,&local_250);
  while( true ) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end(&local_270,&this->records_);
    bVar1 = std::operator!=((_Self *)local_230,&local_270);
    if (!bVar1) break;
    pbVar4 = std::
             _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                          *)local_230);
    this_00 = std::operator<<((ostream *)&iterator._M_node,(string *)pbVar4);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::
    _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)local_230);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&iterator._M_node);
  return;
}

Assistant:

inline void DefaultConsumer::DumpRecordToDisk() {
  std::ofstream staging_ofs
      (data_file_path_.c_str(), std::ofstream::out | std::ofstream::trunc);
  for (std::deque<string>::const_iterator iterator = records_.begin();
       iterator != records_.end(); ++iterator) {
    staging_ofs << *iterator << std::endl;
  }
  staging_ofs.close();
}